

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader.hpp
# Opt level: O2

unsigned_long __thiscall
duckdb::BitReader::ReadBytes<unsigned_long,(unsigned_char)8>(BitReader *this,uint8_t *remainder)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  uint8_t local_31 [9];
  
  local_31[8] = 0;
  bVar2 = InnerReadByte(this,local_31 + 8);
  local_31[7] = 1;
  bVar3 = InnerReadByte(this,local_31 + 7);
  local_31[6] = 2;
  bVar4 = InnerReadByte(this,local_31 + 6);
  local_31[5] = 3;
  bVar5 = InnerReadByte(this,local_31 + 5);
  local_31[4] = 4;
  bVar6 = InnerReadByte(this,local_31 + 4);
  local_31[3] = 5;
  bVar7 = InnerReadByte(this,local_31 + 3);
  local_31[2] = 6;
  bVar8 = InnerReadByte(this,local_31 + 2);
  local_31[1] = 7;
  bVar9 = InnerReadByte(this,local_31 + 1);
  bVar1 = *remainder;
  local_31[0] = '\b';
  bVar10 = InnerRead(this,remainder,local_31);
  this->index = (uint)*remainder + this->index + 0x40;
  return (ulong)bVar10 |
         ((ulong)bVar9 |
         ((ulong)bVar8 |
         (ulong)bVar7 << 8 |
         ((ulong)bVar6 |
         (ulong)bVar5 << 8 | (ulong)((uint)bVar4 | (uint)bVar3 << 8 | (uint)bVar2 << 0x10) << 0x10)
         << 0x10) << 8) << (bVar1 & 0x3f);
}

Assistant:

inline T ReadBytes(const uint8_t &remainder) {
		T result = 0;
		if (BYTES > 0) {
			result = UnsafeNumericCast<T>(result << 8 | InnerReadByte(0));
		}
		if (BYTES > 1) {
			result = UnsafeNumericCast<T>(result << 8 | InnerReadByte(1));
		}
		if (BYTES > 2) {
			result = UnsafeNumericCast<T>(result << 8 | InnerReadByte(2));
		}
		if (BYTES > 3) {
			result = UnsafeNumericCast<T>(result << 8 | InnerReadByte(3));
		}
		if (BYTES > 4) {
			result = UnsafeNumericCast<T>(result << 8 | InnerReadByte(4));
		}
		if (BYTES > 5) {
			result = UnsafeNumericCast<T>(result << 8 | InnerReadByte(5));
		}
		if (BYTES > 6) {
			result = UnsafeNumericCast<T>(result << 8 | InnerReadByte(6));
		}
		if (BYTES > 7) {
			result = UnsafeNumericCast<T>(result << 8 | InnerReadByte(7));
		}
		result = UnsafeNumericCast<T>(result << remainder | InnerRead(remainder, BYTES));
		index += (BYTES << 3) + remainder;
		return result;
	}